

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ortho_rh_no.c
# Opt level: O0

void glmc_ortho_aabb_pz_rh_no(vec3 *box,float padding,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  vec4 *dest_local;
  float padding_local;
  vec3 *box_local;
  float fn;
  float tb;
  float rl;
  __m128 x0;
  
  fVar1 = box[1][0];
  fVar2 = (*box)[0];
  fVar3 = (*box)[1];
  fVar4 = box[1][1];
  fVar9 = -(box[1][2] + padding);
  fVar5 = -((*box)[2] - padding);
  *(float *)((long)dest + 0) = 0.0;
  *(float *)((long)dest + 4) = 0.0;
  *(float *)((long)dest + 8) = 0.0;
  *(float *)((long)dest + 0xc) = 0.0;
  *(float *)((long)(dest + 1) + 0) = 0.0;
  *(float *)((long)(dest + 1) + 4) = 0.0;
  *(float *)((long)(dest + 1) + 8) = 0.0;
  *(float *)((long)(dest + 1) + 0xc) = 0.0;
  *(float *)((long)(dest + 2) + 0) = 0.0;
  *(float *)((long)(dest + 2) + 4) = 0.0;
  *(float *)((long)(dest + 2) + 8) = 0.0;
  *(float *)((long)(dest + 2) + 0xc) = 0.0;
  *(float *)((long)(dest + 3) + 0) = 0.0;
  *(float *)((long)(dest + 3) + 4) = 0.0;
  *(float *)((long)(dest + 3) + 8) = 0.0;
  *(float *)((long)(dest + 3) + 0xc) = 0.0;
  fVar6 = 1.0 / (fVar1 - fVar2);
  fVar7 = 1.0 / (fVar4 - fVar3);
  fVar8 = -1.0 / (fVar5 - fVar9);
  (*dest)[0] = fVar6 * 2.0;
  dest[1][1] = fVar7 * 2.0;
  dest[2][2] = fVar8 * 2.0;
  dest[3][0] = -(fVar1 + fVar2) * fVar6;
  dest[3][1] = -(fVar4 + fVar3) * fVar7;
  dest[3][2] = (fVar5 + fVar9) * fVar8;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_ortho_aabb_pz_rh_no(vec3 box[2], float padding, mat4 dest) {
  glm_ortho_aabb_pz_rh_no(box, padding, dest);
}